

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O3

void __thiscall Exttpose::tpose(Exttpose *this)

{
  DbaseCtrlBlk *pDVar1;
  pointer pTVar2;
  pointer puVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pcVar7;
  int *piVar8;
  pointer pcVar9;
  bool bVar10;
  char cVar11;
  uint uVar12;
  ostream *poVar13;
  long *plVar14;
  pointer piVar15;
  ExttposeArgument *pEVar16;
  runtime_error *prVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  Exttpose *pEVar22;
  int iVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar24;
  long lVar25;
  long lVar26;
  unsigned_long uVar27;
  unsigned_long uVar28;
  vector<TransArray,_std::allocator<TransArray>_> *pvVar29;
  int iVar30;
  ostringstream *poVar31;
  double dVar32;
  int numitem;
  int custid;
  int tid;
  int *buf;
  int l2cnt;
  int null;
  string tmpiset;
  ofstream ofd;
  int file_offset;
  string tmpnam;
  ostringstream tmpnamestrm;
  int local_8b4;
  uint local_8b0;
  int local_8ac;
  int *local_8a8;
  Exttpose *local_8a0;
  ulong local_898;
  DbaseCtrlBlk *local_890;
  undefined8 local_888;
  ulong local_880;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_878;
  long local_870;
  ulong local_868;
  ulong local_860;
  vector<int,_std::allocator<int>_> *local_858;
  vector<char,_std::allocator<char>_> *local_850;
  uint local_844;
  vector<TransArray,_std::allocator<TransArray>_> *local_840;
  undefined1 *local_838 [2];
  undefined1 local_828 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  vector<int,_std::allocator<int>_> *local_7f8;
  long local_7f0;
  undefined1 *local_7e8;
  undefined8 local_7e0;
  undefined1 local_7d8 [16];
  long local_7c8;
  filebuf local_7c0 [24];
  byte abStack_7a8 [216];
  ios_base local_6d0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8 [16];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ofstream *)&local_7c8);
  pDVar1 = &this->dcb;
  DbaseCtrlBlk::get_first_blk(pDVar1);
  DbaseCtrlBlk::get_next_trans(pDVar1,&local_8a8,&local_8b4,&local_8ac,(int *)&local_8b0);
  local_880 = (ulong)local_8b0;
  local_890 = pDVar1;
  while ((this->dcb).readall != '\x01') {
    if (0 < local_8b4) {
      piVar15 = (this->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pEVar16 = this->args;
      piVar5 = (this->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->ocnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar25 = 0;
      do {
        piVar8 = piVar15 + local_8a8[lVar25];
        *piVar8 = *piVar8 + 1;
        if ((pEVar16->use_seq != 0) && (piVar6[local_8a8[lVar25]] != local_8b0)) {
          piVar8 = piVar5 + local_8a8[lVar25];
          *piVar8 = *piVar8 + 1;
          piVar6[local_8a8[lVar25]] = local_8b0;
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 < local_8b4);
    }
    DbaseCtrlBlk::get_next_trans(local_890,&local_8a8,&local_8b4,&local_8ac,(int *)&local_8b0);
  }
  local_898 = (ulong)local_8b0;
  poVar31 = &this->env->logger;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31,"MINMAX ",7);
  poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar31,(int)local_880);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
  plVar14 = (long *)std::ostream::operator<<((ostream *)poVar13,(int)local_898);
  std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
  std::ostream::put((char)plVar14);
  std::ostream::flush();
  pEVar16 = this->args;
  if (pEVar16->DBASE_MAXITEM < 1) {
    iVar23 = 0;
    iVar30 = 0;
  }
  else {
    lVar25 = 0;
    iVar30 = 0;
    iVar23 = 0;
    do {
      if (pEVar16->use_seq == 0) {
        piVar15 = (this->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((long)piVar15[lVar25] < pEVar16->MINSUPPORT) goto LAB_001072be;
        uVar27 = this->numfreq;
        (this->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar25] = (int)uVar27;
        this->numfreq = uVar27 + 1;
        iVar4 = piVar15[lVar25];
        iVar30 = iVar30 + iVar4;
        iVar23 = (iVar23 - iVar4) + pEVar16->DBASE_NUM_TRANS;
      }
      else if ((long)(this->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar25] < pEVar16->MINSUPPORT) {
LAB_001072be:
        (this->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar25] = -1;
      }
      else {
        poVar13 = (ostream *)std::ostream::operator<<((ostream *)&this->env->logger,(int)lVar25);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," SUPP ",6);
        plVar14 = (long *)std::ostream::operator<<
                                    ((ostream *)poVar13,
                                     (this->itcnt).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[lVar25]);
        std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
        std::ostream::put((char)plVar14);
        std::ostream::flush();
        uVar27 = this->numfreq;
        (this->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar25] = (int)uVar27;
        this->numfreq = uVar27 + 1;
        pEVar16 = this->args;
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 < pEVar16->DBASE_MAXITEM);
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->backidx,this->numfreq);
  this->numfreq = 0;
  pEVar16 = this->args;
  if (0 < pEVar16->DBASE_MAXITEM) {
    piVar15 = (this->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar5 = (this->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar25 = pEVar16->MINSUPPORT;
    lVar26 = 0;
    uVar27 = 0;
    do {
      if (pEVar16->use_seq == 0) {
        iVar4 = piVar5[lVar26];
      }
      else {
        iVar4 = piVar15[lVar26];
      }
      uVar28 = uVar27;
      if (lVar25 <= iVar4) {
        uVar28 = uVar27 + 1;
        this->numfreq = uVar28;
        piVar6[uVar27] = (int)lVar26;
      }
      lVar26 = lVar26 + 1;
      uVar27 = uVar28;
    } while (lVar26 < pEVar16->DBASE_MAXITEM);
  }
  poVar31 = &this->env->logger;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31,"numfreq ",8);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar31);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," :  ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," SUMSUP SUMDIFF = ",0x12);
  poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,iVar30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
  plVar14 = (long *)std::ostream::operator<<((ostream *)poVar13,iVar23);
  std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
  std::ostream::put((char)plVar14);
  std::ostream::flush();
  poVar31 = &this->env->summary;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31," F1stats = [ ",0xd);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar31);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
  poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,iVar30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
  poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,iVar23);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," ]",2);
  if (this->numfreq != 0) {
    local_888 = 4;
    local_870 = (long)((ulong)this->args->AMEM / this->numfreq) / 4;
    poVar31 = &this->env->logger;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31,"EXTRARYSZ ",10);
    poVar13 = std::ostream::_M_insert<long>((long)poVar31);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    if (local_870 < 2) {
      local_870 = 2;
    }
    pvVar29 = &this->extary;
    std::vector<TransArray,_std::allocator<TransArray>_>::reserve(pvVar29,this->numfreq);
    if (this->numfreq != 0) {
      uVar21 = 0;
      do {
        std::vector<TransArray,std::allocator<TransArray>>::emplace_back<long&,int&>
                  ((vector<TransArray,std::allocator<TransArray>> *)pvVar29,&local_870,
                   &this->args->num_partitions);
        uVar21 = uVar21 + 1;
      } while (uVar21 < this->numfreq);
    }
    local_8a0 = this;
    local_840 = pvVar29;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    pEVar16 = local_8a0->args;
    iVar23 = pEVar16->num_partitions;
    dVar32 = ceil((double)(((int)local_898 - (int)local_880) + 1) / (double)iVar23);
    pDVar1 = local_890;
    local_868 = (ulong)(uint)(int)dVar32;
    if (pEVar16->do_invert != 0) {
      if (1 < iVar23) {
        DbaseCtrlBlk::get_first_blk(local_890);
        pEVar22 = local_8a0;
        DbaseCtrlBlk::get_next_trans(pDVar1,&local_8a8,&local_8b4,&local_8ac,(int *)&local_8b0);
        pEVar16 = pEVar22->args;
        iVar23 = pEVar16->num_partitions;
      }
      pEVar22 = local_8a0;
      if (0 < iVar23) {
        local_850 = (vector<char,_std::allocator<char>_> *)
                    CONCAT44(local_850._4_4_,(int)local_880 + (int)local_868);
        local_878 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(local_878._4_4_,(int)local_898 + 1);
        lVar25 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pEVar16->idxfn)._M_dataplus._M_p,
                     (pEVar16->idxfn)._M_string_length);
          if (1 < pEVar22->args->num_partitions) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".P",2);
            std::ostream::operator<<((ostream *)local_1a8,(int)lVar25);
            iVar23 = (int)lVar25 * (int)local_868 + (int)local_850;
            if ((int)local_898 < iVar23) {
              iVar23 = (int)local_878;
            }
            piVar15 = (pEVar22->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar5 = (pEVar22->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (piVar15 != piVar5) {
              memset(piVar15,0,((long)piVar5 + (-4 - (long)piVar15) & 0xfffffffffffffffcU) + 4);
            }
            piVar15 = (pEVar22->ocnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar5 = (pEVar22->ocnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (piVar15 != piVar5) {
              memset(piVar15,0xff,((long)piVar5 + (-4 - (long)piVar15) & 0xfffffffffffffffcU) + 4);
            }
            piVar15 = (pEVar22->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar5 = (pEVar22->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (piVar15 != piVar5) {
              memset(piVar15,0,((long)piVar5 + (-4 - (long)piVar15) & 0xfffffffffffffffcU) + 4);
            }
            while (((pEVar22->dcb).readall != '\x01' && ((int)local_8b0 < iVar23))) {
              if (0 < local_8b4) {
                piVar15 = (pEVar22->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pEVar16 = pEVar22->args;
                piVar5 = (pEVar22->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                piVar6 = (pEVar22->ocnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                lVar26 = 0;
                do {
                  piVar8 = piVar15 + local_8a8[lVar26];
                  *piVar8 = *piVar8 + 1;
                  if ((pEVar16->use_seq != 0) && (piVar6[local_8a8[lVar26]] != local_8b0)) {
                    piVar8 = piVar5 + local_8a8[lVar26];
                    *piVar8 = *piVar8 + 1;
                    piVar6[local_8a8[lVar26]] = local_8b0;
                  }
                  lVar26 = lVar26 + 1;
                } while (lVar26 < local_8b4);
              }
              DbaseCtrlBlk::get_next_trans
                        (local_890,&local_8a8,&local_8b4,&local_8ac,(int *)&local_8b0);
            }
          }
          std::__cxx11::stringbuf::str();
          poVar31 = &pEVar22->env->logger;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31,"OPENED ",7);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar31,local_3b8[0]._M_dataplus._M_p,
                               local_3b8[0]._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
          std::ofstream::open((string *)&local_7c8,(_Ios_Openmode)local_3b8);
          if ((abStack_7a8[*(long *)(local_7c8 + -0x18)] & 5) != 0) {
            prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(local_5c8,"Can\'t open file ",local_3b8);
            std::runtime_error::runtime_error(prVar17,(string *)local_5c8);
            __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          local_5c8[0]._M_dataplus._M_p._0_4_ = 0;
          local_818._M_dataplus._M_p._0_4_ = 0xffffffff;
          pEVar16 = pEVar22->args;
          if (pEVar16->DBASE_MAXITEM < 1) {
            lVar26 = 0;
          }
          else {
            lVar26 = 0;
            do {
              if ((pEVar22->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar26] == -1) {
                pbVar24 = local_5c8;
                if (pEVar16->no_minus_off == '\0') {
                  pbVar24 = &local_818;
                }
                std::ostream::write((char *)&local_7c8,(long)pbVar24);
              }
              else {
                std::ostream::write((char *)&local_7c8,(long)local_5c8);
                *(long *)(*(long *)&(pEVar22->extary).
                                    super__Vector_base<TransArray,_std::allocator<TransArray>_>.
                                    _M_impl.super__Vector_impl_data._M_start
                                    [(pEVar22->freqidx).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar26]].offset.
                                    super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data + lVar25 * 8) =
                     (long)(int)local_5c8[0]._M_dataplus._M_p;
                pEVar16 = pEVar22->args;
                if (pEVar16->use_seq == 0) {
                  if (pEVar16->use_diff == '\0') {
                    local_5c8[0]._M_dataplus._M_p._0_4_ =
                         (pEVar22->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar26] +
                         (int)local_5c8[0]._M_dataplus._M_p;
                  }
                  else {
                    local_5c8[0]._M_dataplus._M_p._0_4_ =
                         (pEVar16->DBASE_NUM_TRANS + (int)local_5c8[0]._M_dataplus._M_p) -
                         (pEVar22->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar26];
                  }
                }
                else if (pEVar16->use_newformat == '\0') {
                  local_5c8[0]._M_dataplus._M_p._0_4_ =
                       (int)local_5c8[0]._M_dataplus._M_p +
                       (pEVar22->itcnt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar26] * 2 +
                       (pEVar22->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar26];
                }
                else {
                  local_5c8[0]._M_dataplus._M_p._0_4_ =
                       (int)local_5c8[0]._M_dataplus._M_p +
                       (pEVar22->itlen).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar26] * 2;
                }
              }
              lVar26 = lVar26 + 1;
              pEVar16 = pEVar22->args;
            } while (lVar26 < pEVar16->DBASE_MAXITEM);
          }
          poVar31 = &pEVar22->env->logger;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31,"OFF ",4);
          poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar31,(int)lVar26);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          plVar14 = (long *)std::ostream::operator<<
                                      ((ostream *)poVar13,(int)local_5c8[0]._M_dataplus._M_p);
          std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
          std::ostream::put((char)plVar14);
          std::ostream::flush();
          std::ostream::write((char *)&local_7c8,(long)local_5c8);
          std::ofstream::close();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8[0]._M_dataplus._M_p != &local_3b8[0].field_2) {
            operator_delete(local_3b8[0]._M_dataplus._M_p);
          }
          lVar25 = lVar25 + 1;
          pEVar16 = pEVar22->args;
        } while (lVar25 < pEVar16->num_partitions);
      }
    }
    pEVar22 = local_8a0;
    poVar31 = &local_8a0->env->logger;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31,"Wrote Offt ",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar31 + -0x18) + (char)poVar31);
    std::ostream::put((char)poVar31);
    std::ostream::flush();
    local_7f8 = &pEVar22->fidx;
    std::vector<int,_std::allocator<int>_>::resize(local_7f8,pEVar22->numfreq);
    pEVar16 = pEVar22->args;
    if (pEVar16->do_l2 != 0) {
      std::fstream::fstream(local_3b8);
      std::fstream::fstream(local_5c8);
      pvVar29 = local_840;
      local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
      local_818._M_string_length = 0;
      local_818.field_2._M_local_buf[0] = '\0';
      local_7e8 = local_7d8;
      local_7e0 = 0;
      local_7d8[0] = 0;
      pEVar16 = pEVar22->args;
      if (pEVar16->use_seq != 0) {
        std::__cxx11::string::_M_assign((string *)&local_818);
        std::fstream::open((string *)local_5c8,(_Ios_Openmode)&local_818);
        cVar11 = std::__basic_file<char>::is_open();
        if (cVar11 == '\0') {
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar17,"Can\'t open out file");
          goto LAB_001083e5;
        }
        pEVar16 = pEVar22->args;
      }
      pcVar7 = (pEVar16->tmpfn)._M_dataplus._M_p;
      local_838[0] = local_828;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_838,pcVar7,pcVar7 + (pEVar16->tmpfn)._M_string_length);
      std::__cxx11::string::append((char *)local_838);
      std::__cxx11::string::operator=((string *)&local_7e8,(string *)local_838);
      if (local_838[0] != local_828) {
        operator_delete(local_838[0]);
      }
      std::fstream::open((string *)local_3b8,(_Ios_Openmode)&local_7e8);
      pDVar1 = local_890;
      cVar11 = std::__basic_file<char>::is_open();
      if (cVar11 == '\0') {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar17,"Can\'t open out file");
LAB_001083e5:
        __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (pEVar22->args->use_seq != 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                  (&pEVar22->seq2,pEVar22->numfreq * pEVar22->numfreq);
      }
      local_878 = &pEVar22->itcnt2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (local_878,pEVar22->numfreq * (pEVar22->numfreq - 1) >> 1);
      local_850 = &pEVar22->ocust;
      std::vector<char,_std::allocator<char>_>::resize
                (local_850,pEVar22->numfreq * (pEVar22->numfreq - 1) >> 1);
      local_858 = &pEVar22->offsets;
      std::vector<int,_std::allocator<int>_>::resize(local_858,pEVar22->numfreq);
      uVar12 = (uint)pEVar22->numfreq;
      if (0 < (int)uVar12) {
        uVar21 = (ulong)(uVar12 & 0x7fffffff);
        piVar15 = (local_858->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start + (pEVar22->numfreq - uVar21);
        iVar23 = 0;
        do {
          *piVar15 = iVar23;
          iVar23 = iVar23 + (int)(uVar21 - 1);
          piVar15 = piVar15 + 1;
          bVar10 = 1 < uVar21;
          uVar21 = uVar21 - 1;
        } while (bVar10);
      }
      DbaseCtrlBlk::get_first_blk(pDVar1);
      DbaseCtrlBlk::get_next_trans(pDVar1,&local_8a8,&local_8b4,&local_8ac,(int *)&local_8b0);
      cVar11 = (pEVar22->dcb).readall;
      while (cVar11 != '\x01') {
        local_860 = 0;
        local_844 = local_8b0;
        while ((cVar11 = (pEVar22->dcb).readall, cVar11 != '\x01' && (local_844 == local_8b0))) {
          if (0 < local_8b4) {
            uVar21 = 1;
            lVar26 = 4;
            lVar25 = 0;
            iVar23 = local_8b4;
            do {
              uVar12 = (pEVar22->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[local_8a8[lVar25]];
              lVar18 = (long)(int)uVar12;
              if (lVar18 != -1) {
                if (pEVar22->args->use_seq == 0) {
                  if (lVar25 + 1 < (long)iVar23) {
                    iVar30 = (local_858->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar18];
                    uVar19 = uVar21 & 0xffffffff;
                    lVar18 = lVar26;
                    local_7f0 = lVar25;
                    do {
                      iVar23 = (local_8a0->freqidx).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [*(int *)((long)local_8a8 + lVar18)];
                      if (iVar23 != -1) {
                        puVar3 = (local_878->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_start +
                                 (int)(iVar23 + ~uVar12 + iVar30);
                        *puVar3 = *puVar3 + '\x01';
                        if (*puVar3 == '\0') {
                          std::ostream::write(local_3b8[0].field_2._M_local_buf,
                                              (long)(local_8a8 + local_7f0));
                          std::ostream::write(local_3b8[0].field_2._M_local_buf,
                                              (long)local_8a8 + lVar18);
                        }
                      }
                      lVar18 = lVar18 + 4;
                      uVar20 = (int)uVar19 + 1;
                      uVar19 = (ulong)uVar20;
                      pEVar22 = local_8a0;
                      pvVar29 = local_840;
                      iVar23 = local_8b4;
                    } while ((int)uVar20 < local_8b4);
                  }
                }
                else {
                  pTVar2 = (pvVar29->super__Vector_base<TransArray,_std::allocator<TransArray>_>).
                           _M_impl.super__Vector_impl_data._M_start + lVar18;
                  if (pTVar2->theSize == 0) {
                    (local_7f8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[(int)local_860] = uVar12;
                    local_860 = (ulong)((int)local_860 + 1);
                    piVar8 = *(int **)&(pTVar2->theArray).
                                       super__Vector_base<int,_std::allocator<int>_>;
                    *piVar8 = local_8ac;
                    piVar8[1] = local_8ac;
                    pTVar2->theSize = 2;
                    iVar23 = local_8b4;
                  }
                  else {
                    *(int *)(*(long *)&(pTVar2->theArray).
                                       super__Vector_base<int,_std::allocator<int>_> + 4) =
                         local_8ac;
                  }
                  if (lVar25 + 1 < (long)iVar23) {
                    iVar30 = (local_858->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar18];
                    uVar19 = uVar21;
                    do {
                      iVar4 = (pEVar22->freqidx).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[local_8a8[uVar19]];
                      if (iVar4 != -1) {
                        (local_850->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_start[(int)(iVar4 + ~uVar12 + iVar30)] = '\x01';
                        iVar23 = local_8b4;
                      }
                      uVar19 = uVar19 + 1;
                    } while ((int)uVar19 < iVar23);
                  }
                }
              }
              lVar25 = lVar25 + 1;
              uVar21 = uVar21 + 1;
              lVar26 = lVar26 + 4;
            } while (lVar25 < iVar23);
          }
          DbaseCtrlBlk::get_next_trans(local_890,&local_8a8,&local_8b4,&local_8ac,(int *)&local_8b0)
          ;
        }
        if (pEVar22->args->use_seq != 0) {
          process_cust(pEVar22,(int)local_860,(fstream *)local_5c8,(fstream *)local_3b8);
          cVar11 = (pEVar22->dcb).readall;
        }
      }
      pcVar9 = (pEVar22->ocust).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pEVar22->ocust).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish != pcVar9) {
        (pEVar22->ocust).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar9;
      }
      poVar31 = &pEVar22->env->logger;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31,"2-IT ",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31," ",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar31 + -0x18) + (char)poVar31);
      std::ostream::put((char)poVar31);
      std::ostream::flush();
      local_838[0] = (undefined1 *)((ulong)local_838[0] & 0xffffffff00000000);
      pEVar16 = pEVar22->args;
      if (pEVar16->use_seq == 0) {
        iVar23 = 0;
      }
      else {
        std::ofstream::open((string *)&local_7c8,(int)pEVar16 + 0xa0);
        if ((abStack_7a8[*(long *)(local_7c8 + -0x18)] & 5) != 0) {
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar17,"Can\'t open seq file");
          __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        sort_get_l2(pEVar22,(int *)local_838,(fstream *)local_5c8,(ofstream *)&local_7c8,
                    &pEVar22->seq2,false);
        std::ofstream::close();
        poVar31 = &pEVar22->env->logger;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31,"SEQ2 cnt ",9);
        iVar23 = (int)local_838[0];
        plVar14 = (long *)std::ostream::operator<<((ostream *)poVar31,(int)local_838[0]);
        std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
        std::ostream::put((char)plVar14);
        std::ostream::flush();
        poVar31 = &pEVar22->env->summary;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31," ",1);
        std::ostream::operator<<((ostream *)poVar31,iVar23);
        pEVar16 = pEVar22->args;
      }
      std::ofstream::open((string *)&local_7c8,(int)pEVar16 + 0x80);
      if ((abStack_7a8[*(long *)(local_7c8 + -0x18)] & 5) != 0) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar17,"Can\'t open it2 file");
        __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      sort_get_l2(pEVar22,(int *)local_838,(fstream *)local_3b8,(ofstream *)&local_7c8,local_878,
                  false);
      std::ofstream::close();
      poVar31 = &pEVar22->env->logger;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31,"SORT ",5);
      iVar30 = (int)local_838[0];
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar31,(int)local_838[0]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"  ",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      poVar31 = &pEVar22->env->summary;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar31," F2stats = [",0xc);
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar31,iVar30);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,iVar23);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," ]",2);
      piVar15 = (pEVar22->offsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((pEVar22->offsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar15) {
        (pEVar22->offsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar15;
      }
      puVar3 = (pEVar22->itcnt2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((pEVar22->itcnt2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar3) {
        (pEVar22->itcnt2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar3;
      }
      puVar3 = (pEVar22->seq2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((pEVar22->seq2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar3) {
        (pEVar22->seq2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar3;
      }
      if (local_7e8 != local_7d8) {
        operator_delete(local_7e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_818._M_dataplus._M_p != &local_818.field_2) {
        operator_delete(local_818._M_dataplus._M_p);
      }
      std::fstream::~fstream(local_5c8);
      std::fstream::~fstream(local_3b8);
      pEVar16 = pEVar22->args;
    }
    if (pEVar16->do_invert != 0) {
      do_invert_db(pEVar22,(int)local_868,(int)local_880,(int)local_898);
    }
    piVar15 = (pEVar22->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((pEVar22->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar15) {
      (pEVar22->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar15;
    }
    piVar15 = (pEVar22->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((pEVar22->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar15) {
      (pEVar22->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar15;
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  local_7c8 = _VTT;
  *(undefined8 *)(local_7c0 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_7c0);
  std::ios_base::~ios_base(local_6d0);
  return;
}

Assistant:

void Exttpose::tpose() {
    int i, j, l;
    int idx;
    int custid, tid, numitem, fcnt;
    ofstream ofd;
    int sumsup = 0, sumdiff = 0;

    //count 1 items
    int *buf;
    dcb.get_first_blk();
    dcb.get_next_trans(buf, numitem, tid, custid);
    int mincustid = custid;
    while (!dcb.eof()) {
        //env.logger << custid << " " << tid << " " << numitem;
        for (j = 0; j < numitem; j++) {
            //env.logger << " " << buf[j] << flush;
            itlen[buf[j]]++;
            if (args.use_seq && ocnt[buf[j]] != custid) {
                itcnt[buf[j]]++;
                ocnt[buf[j]] = custid;
            }
            //if (buf[j] == 17) env.logger << " " << tid;
        }
        //env.logger << endl;
        dcb.get_next_trans(buf, numitem, tid, custid);
    }
    //env.logger << endl;
    int maxcustid = static_cast<int>(custid);
    env.logger << "MINMAX " << mincustid << " " << maxcustid << endl;

    for (i = 0; i < args.DBASE_MAXITEM; i++) {
        if (args.use_seq) {
            if (itcnt[i] >= args.MINSUPPORT) {
                env.logger << i << " SUPP " << itcnt[i] << endl;
                freqidx[i] = numfreq;
                numfreq++;
            } else freqidx[i] = static_cast<int>(-1);
        } else {
            if (itlen[i] >= args.MINSUPPORT) {
                freqidx[i] = numfreq;
                numfreq++;
                sumsup += itlen[i];
                sumdiff += (args.DBASE_NUM_TRANS - itlen[i]);
            } else freqidx[i] = static_cast<int>(-1);
        }
        //if (i == 17) env.logger << " 17 SUP " << itlen[17] << endl;
    }

    backidx.resize(numfreq);

    numfreq = 0;
    for (i = 0; i < args.DBASE_MAXITEM; i++) {
        if (args.use_seq) {
            if (itcnt[i] >= args.MINSUPPORT)
                backidx[numfreq++] = i;
        } else {
            if (itlen[i] >= args.MINSUPPORT)
                backidx[numfreq++] = i;
        }
    }

    env.logger << "numfreq " << numfreq << " :  " << " SUMSUP SUMDIFF = " << sumsup << " " << sumdiff << endl;

    env.summary << " F1stats = [ " << numfreq << " " << sumsup << " " << sumdiff << " ]";

    if (numfreq == 0) return;

    long extarysz = args.AMEM / numfreq;
    extarysz /= INT_SIZE;
    env.logger << "EXTRARYSZ " << extarysz << endl;
    if (extarysz < 2) extarysz = 2;

    extary.reserve(numfreq);

    for (i = 0; i < numfreq; i++) {
        extary.emplace_back(extarysz, args.num_partitions);
    }

    ostringstream tmpnamestrm;
    int plb, pub, pblk;
    pblk = static_cast<int>(ceil(((double) (maxcustid - mincustid + 1)) / args.num_partitions));
    if (args.do_invert) {
        if (args.num_partitions > 1) {
            dcb.get_first_blk();
            dcb.get_next_trans(buf, numitem, tid, custid);
        }
        for (j = 0; j < args.num_partitions; j++) {
            //construct offsets for 1-itemsets
            tmpnamestrm << args.idxfn;
            if (args.num_partitions > 1) {
                tmpnamestrm << ".P" << j;
                plb = j * pblk + mincustid;
                pub = plb + pblk;
                if (pub > maxcustid) pub = maxcustid + 1;
                std::fill(itcnt.begin(), itcnt.end(), 0);
                std::fill(ocnt.begin(), ocnt.end(), -1);
                std::fill(itlen.begin(), itlen.end(), 0);

                for (; !dcb.eof() && custid < pub;) {
                    for (i = 0; i < numitem; i++) {
                        itlen[buf[i]]++;
                        if (args.use_seq && ocnt[buf[i]] != custid) {
                            itcnt[buf[i]]++;
                            ocnt[buf[i]] = custid;
                        }
                    }
                    dcb.get_next_trans(buf, numitem, tid, custid);
                }
            }
            string tmpnam = tmpnamestrm.str();
            env.logger << "OPENED " << tmpnam << endl;
            ofd.open(tmpnam, ios::binary);
            if (!ofd) {
                throw runtime_error("Can't open file " + tmpnam);
            }

            int file_offset = 0;
            int null = -1;
            for (i = 0; i < args.DBASE_MAXITEM; i++) {
                //if (i == 17) env.logger << "LIDX " << i << " " << itlen[i] << endl;
                if (freqidx[i] != -1) {
                    ofd.write((char *) &file_offset, INT_SIZE);
                    extary[freqidx[i]].set_offset(file_offset, j);
                    if (args.use_seq) {
                        if (args.use_newformat) file_offset += (2 * itlen[i]);
                        else file_offset += (2 * itcnt[i] + itlen[i]);
                    } else {
                        if (args.use_diff) file_offset += (args.DBASE_NUM_TRANS - itlen[i]);
                        else file_offset += itlen[i];
                    }
                } else if (args.no_minus_off) {
                    ofd.write((char *) &file_offset, INT_SIZE);
                } else ofd.write((char *) &null, INT_SIZE);
                //env.logger << "OFF " << i <<" " << file_offset << endl;
            }
            env.logger << "OFF " << i << " " << file_offset << endl;
            ofd.write((char *) &file_offset, INT_SIZE);
            ofd.close();
        }
    }

    env.logger << "Wrote Offt " << endl;

    fidx.resize(numfreq);

    int ocid = -1;
    if (args.do_l2) {
        fstream isetfd;
        fstream seqfd;
        string tmpseq, tmpiset;

        if (args.use_seq) {
            tmpseq = args.tmpfn;
            seqfd.open(tmpseq, ios::binary | ios::trunc);
            if (!seqfd.is_open()) {
                throw runtime_error("Can't open out file");
            }
        }
        tmpiset = args.tmpfn + "iset";
        isetfd.open(tmpiset, ios::binary | ios::trunc);

        if (!isetfd.is_open()) {
            throw runtime_error("Can't open out file");
        }

        if (args.use_seq) {
            seq2.reserve(numfreq * numfreq);
        }

        itcnt2.resize(numfreq * (numfreq - 1) / 2);
        ocust.resize(numfreq * (numfreq - 1) / 2);
        offsets.resize(numfreq);

        int offt = 0;
        int start = static_cast<int>(numfreq);
        for (i = start - 1; i >= 0; i--) {
            offsets[numfreq - i - 1] = offt;
            offt += i;
        }

        ocid = -1;
        int lit;
        //count 2-itemsets
        dcb.get_first_blk();
        dcb.get_next_trans(buf, numitem, tid, custid);
        while (!dcb.eof()) {
            fcnt = 0;
            ocid = custid;
            while (!dcb.eof() && ocid == custid) {
                for (j = 0; j < numitem; j++) {
                    idx = freqidx[buf[j]];
                    if (idx != -1) {
                        if (args.use_seq) {
                            if (extary[idx].size() == 0) {
                                fidx[fcnt] = idx;
                                fcnt++;
                                //extary[idx].add(isetfd,tid,args.use_seq,0);
                                //extary[idx].add(isetfd,tid,args.use_seq,0);
                                extary[idx].setitem(0, tid);
                                extary[idx].setitem(1, tid);
                                extary[idx].setsize(2);
                            } else {
                                extary[idx].setitem(1, tid);
                            }

                            lit = offsets[idx] - idx - 1;
                            for (l = j + 1; l < numitem; l++) {
                                if (freqidx[buf[l]] != -1) {
                                    ocust[lit + freqidx[buf[l]]] = 1;
                                }
                            }
                        } else {
                            lit = offsets[idx] - idx - 1;
                            for (l = j + 1; l < numitem; l++) {
                                if (freqidx[buf[l]] != -1) {
                                    if ((++itcnt2[lit + freqidx[buf[l]]]) == 0) {
                                        isetfd.write((char *) &buf[j], INT_SIZE);
                                        isetfd.write((char *) &buf[l], INT_SIZE);
                                    }
                                }
                            }
                        }
                    }
                }
                dcb.get_next_trans(buf, numitem, tid, custid);
            }

            if (args.use_seq) {
                process_cust(fcnt, seqfd, isetfd);
            }
        }
        ocust.clear();
        env.logger << "2-IT " << " " << endl;

        //write 2-itemsets counts to file
        int l2cnt = 0;
        if (args.use_seq) {
            ofd.open(args.seqfn, ios::binary);
            if (ofd.fail()) {
                throw runtime_error("Can't open seq file");
            }
            sort_get_l2(l2cnt, seqfd, ofd, seq2, true);

            ofd.close();
            env.logger << "SEQ2 cnt " << l2cnt << endl;
            env.summary << " " << l2cnt;
        }
        int seqs = l2cnt;

        ofd.open(args.it2fn, ios::binary);
        //if ((fd = open(args.it2fn, (O_WRONLY|O_CREAT|O_TRUNC|O_BINARY), 0666)) < 0){
        if (ofd.fail()) {
            throw runtime_error("Can't open it2 file");
        }
        sort_get_l2(l2cnt, isetfd, ofd, itcnt2, false);
        ofd.close();
        env.logger << "SORT " << l2cnt << "  " << endl;

        env.summary << " F2stats = [" << l2cnt << " " << seqs << " ]";
        offsets.clear();
        itcnt2.clear();
        seq2.clear();
    }

    if (args.do_invert) {
        do_invert_db(pblk, mincustid, maxcustid);
    }

    freqidx.clear();
    backidx.clear();
}